

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O3

Amap_Lib_t * Amap_ParseTokens(Vec_Ptr_t *vTokens,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_MmFlex_t *pAVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Amap_Lib_t *p;
  Amap_Gat_t *pAVar8;
  void **ppvVar9;
  size_t sVar10;
  char *pcVar11;
  Amap_Lib_t *pAVar12;
  undefined4 uVar13;
  ulong uVar14;
  long lVar15;
  Amap_Gat_t *pAVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  double dVar20;
  char *pcVar21;
  Amap_Lib_t *pAVar22;
  char *local_60;
  
  p = Amap_LibAlloc();
  if (0 < vTokens->nSize) {
    pcVar21 = (char *)*vTokens->pArray;
    uVar7 = 1;
    do {
      iVar5 = strcmp(pcVar21,"GATE");
      if (iVar5 != 0) {
        Amap_LibFree(p);
        pcVar11 = "The first line should begin with %s.\n";
        pcVar21 = "GATE";
LAB_003cbcec:
        printf(pcVar11,pcVar21);
        return (Amap_Lib_t *)0x0;
      }
      iVar5 = Amap_ParseCountPins(vTokens,uVar7);
      pAVar8 = (Amap_Gat_t *)Aig_MmFlexEntryFetch(p->pMemGates,iVar5 * 0x48 + 0x40);
      pAVar8->pLib = (Amap_Lib_t *)0x0;
      pAVar8->pTwin = (Amap_Gat_t *)0x0;
      pAVar8->pName = (char *)0x0;
      pAVar8->pOutName = (char *)0x0;
      pAVar8->dArea = 0.0;
      pAVar8->pForm = (char *)0x0;
      pAVar8->pFunc = (uint *)0x0;
      *(undefined8 *)&pAVar8->field_0x38 = 0;
      *(uint *)&pAVar8->field_0x38 = p->vGates->nSize & 0x7fffff;
      pVVar2 = p->vGates;
      uVar6 = pVVar2->nSize;
      if (uVar6 == pVVar2->nCap) {
        if ((int)uVar6 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar9;
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar2->pArray,(ulong)uVar6 << 4);
          }
          pVVar2->pArray = ppvVar9;
          pVVar2->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar9 = pVVar2->pArray;
      }
      iVar1 = pVVar2->nSize;
      pVVar2->nSize = iVar1 + 1;
      ppvVar9[iVar1] = pAVar8;
      pAVar8->pLib = p;
      pAVar8->field_0x3b = (char)iVar5;
      uVar6 = vTokens->nSize;
      if ((int)uVar6 <= (int)uVar7) break;
      pcVar21 = (char *)vTokens->pArray[uVar7];
      if (pcVar21 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pAVar3 = p->pMemGates;
        sVar10 = strlen(pcVar21);
        pcVar11 = Aig_MmFlexEntryFetch(pAVar3,(int)sVar10 + 1);
        strcpy(pcVar11,pcVar21);
        uVar6 = vTokens->nSize;
      }
      pAVar8->pName = pcVar11;
      if ((int)uVar6 <= (int)(uVar7 + 1)) break;
      ppvVar9 = vTokens->pArray;
      dVar20 = atof((char *)ppvVar9[uVar7 + 1]);
      pAVar8->dArea = dVar20;
      if (uVar6 <= uVar7 + 2) break;
      pcVar21 = (char *)ppvVar9[uVar7 + 2];
      if (pcVar21 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pAVar3 = p->pMemGates;
        sVar10 = strlen(pcVar21);
        pcVar11 = Aig_MmFlexEntryFetch(pAVar3,(int)sVar10 + 1);
        strcpy(pcVar11,pcVar21);
        uVar6 = vTokens->nSize;
      }
      pAVar8->pOutName = pcVar11;
      if ((int)uVar6 <= (int)(uVar7 + 3)) break;
      pcVar21 = (char *)vTokens->pArray[uVar7 + 3];
      uVar6 = Amap_CollectFormulaTokens(vTokens,pcVar21,uVar7 + 4);
      if (pcVar21 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pAVar3 = p->pMemGates;
        sVar10 = strlen(pcVar21);
        pcVar11 = Aig_MmFlexEntryFetch(pAVar3,(int)sVar10 + 1);
        strcpy(pcVar11,pcVar21);
      }
      pAVar8->pForm = pcVar11;
      pAVar16 = pAVar8 + 1;
      if (*(uint *)&pAVar8->field_0x38 < 0x1000000) {
        uVar7 = *(uint *)&pAVar8->field_0x38 >> 0x18;
      }
      else {
        uVar19 = (ulong)uVar6;
        lVar15 = 0;
        lVar17 = 0;
        do {
          if ((int)uVar6 < 0) goto LAB_003cbd4b;
          uVar14 = (ulong)(uint)vTokens->nSize;
          if (vTokens->nSize <= (int)(uVar6 + (int)lVar17)) goto LAB_003cbd4b;
          ppvVar9 = vTokens->pArray;
          iVar5 = strcmp((char *)ppvVar9[uVar19 + lVar17],"PIN");
          if (iVar5 != 0) {
            Amap_LibFree(p);
            pcVar21 = pAVar8->pName;
            pcVar11 = "Cannot parse gate %s.\n";
            goto LAB_003cbcec;
          }
          if (uVar14 <= uVar19 + lVar17 + 1) goto LAB_003cbd4b;
          pcVar21 = (char *)ppvVar9[uVar19 + lVar17 + 1];
          if (pcVar21 == (char *)0x0) {
            pAVar12 = (Amap_Lib_t *)0x0;
          }
          else {
            pAVar3 = p->pMemGates;
            sVar10 = strlen(pcVar21);
            pAVar12 = (Amap_Lib_t *)Aig_MmFlexEntryFetch(pAVar3,(int)sVar10 + 1);
            strcpy((char *)pAVar12,pcVar21);
            uVar14 = (ulong)(uint)vTokens->nSize;
          }
          (&pAVar16->pLib)[lVar17] = pAVar12;
          if ((int)uVar14 <= (int)(uVar6 + (int)lVar17 + 2)) goto LAB_003cbd4b;
          ppvVar9 = vTokens->pArray;
          pcVar21 = (char *)ppvVar9[uVar19 + lVar17 + 2];
          iVar5 = strcmp(pcVar21,"UNKNOWN");
          if (iVar5 == 0) {
            uVar13 = 0;
          }
          else {
            iVar5 = strcmp(pcVar21,"INV");
            if (iVar5 == 0) {
              uVar13 = 1;
            }
            else {
              iVar5 = strcmp(pcVar21,"NONINV");
              uVar13 = 2;
              if (iVar5 != 0) {
                Amap_LibFree(p);
                printf("Cannot read phase of pin %s of gate %s\n",(&pAVar8[1].pLib)[lVar17],
                       pAVar8->pName);
                return (Amap_Lib_t *)0x0;
              }
            }
          }
          *(undefined4 *)(&pAVar8[1].pTwin + lVar17) = uVar13;
          if (uVar14 <= uVar19 + lVar17 + 3) goto LAB_003cbd4b;
          pcVar21 = (char *)atof((char *)ppvVar9[uVar19 + lVar17 + 3]);
          (&pAVar8[1].pName)[lVar17] = pcVar21;
          if (uVar14 <= uVar19 + lVar17 + 4) goto LAB_003cbd4b;
          pcVar21 = (char *)atof((char *)ppvVar9[uVar19 + lVar17 + 4]);
          (&pAVar8[1].pOutName)[lVar17] = pcVar21;
          if (uVar14 <= uVar19 + lVar17 + 5) goto LAB_003cbd4b;
          pAVar12 = (Amap_Lib_t *)atof((char *)ppvVar9[uVar19 + lVar17 + 5]);
          (&pAVar8[1].dArea)[lVar17] = (double)pAVar12;
          if (uVar14 <= uVar19 + lVar17 + 6) goto LAB_003cbd4b;
          pcVar21 = (char *)atof((char *)ppvVar9[uVar19 + lVar17 + 6]);
          (&pAVar8[1].pForm)[lVar17] = pcVar21;
          if (uVar14 <= uVar19 + lVar17 + 7) goto LAB_003cbd4b;
          pAVar22 = (Amap_Lib_t *)atof((char *)ppvVar9[uVar19 + lVar17 + 7]);
          (&pAVar8[1].pFunc)[lVar17] = (uint *)pAVar22;
          if (uVar14 <= uVar19 + lVar17 + 8) goto LAB_003cbd4b;
          dVar20 = atof((char *)ppvVar9[uVar19 + lVar17 + 8]);
          *(double *)(&pAVar8[1].field_0x38 + lVar17 * 8) = dVar20;
          if ((double)pAVar12 <= (double)pAVar22) {
            pAVar12 = pAVar22;
          }
          (&pAVar8[2].pLib)[lVar17] = pAVar12;
          uVar7 = (uint)(byte)pAVar8->field_0x3b;
          lVar17 = lVar17 + 9;
          uVar14 = (long)&pAVar16[1].pTwin + lVar15;
          lVar15 = lVar15 + 0x48;
        } while (uVar14 < (long)pAVar16 + (ulong)(byte)pAVar8->field_0x3b * 0x48);
        uVar6 = uVar6 + (int)lVar17;
      }
      if (((uVar7 == 1) && (*(char *)&pAVar16->pLib->pName == '*')) &&
         (*(char *)((long)&pAVar16->pLib->pName + 1) == '\0')) {
        pAVar8 = Amap_ParseGateWithSamePins(pAVar8);
        pVVar2 = p->vGates;
        uVar7 = pVVar2->nSize;
        if ((int)uVar7 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
        }
        ppvVar9 = pVVar2->pArray;
        iVar5 = uVar7 - 1;
        pVVar2->nSize = iVar5;
        if (iVar5 == pVVar2->nCap) {
          if (uVar7 < 0x11) {
            if (ppvVar9 == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(ppvVar9,0x80);
            }
            uVar7 = 0x10;
          }
          else {
            uVar7 = iVar5 * 2;
            if (ppvVar9 == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar7 * 8);
            }
            else {
              ppvVar9 = (void **)realloc(ppvVar9,(ulong)uVar7 * 8);
            }
          }
          pVVar2->pArray = ppvVar9;
          pVVar2->nCap = uVar7;
        }
        iVar5 = pVVar2->nSize;
        pVVar2->nSize = iVar5 + 1;
        ppvVar9[iVar5] = pAVar8;
      }
      if (((int)uVar6 < 0) || (vTokens->nSize <= (int)uVar6)) break;
      uVar7 = uVar6 + 1;
      pcVar21 = (char *)vTokens->pArray[uVar6];
      iVar5 = strcmp(pcVar21,".end");
      if (iVar5 == 0) {
        lVar15 = (long)p->vGates->nSize;
        if (0 < lVar15) {
          ppvVar9 = p->vGates->pArray;
          lVar17 = 0;
          uVar7 = 0;
          local_60 = (char *)0x0;
          pvVar18 = (void *)0x0;
          do {
            pvVar4 = ppvVar9[lVar17];
            if (pvVar18 != (void *)0x0) {
              pcVar21 = *(char **)((long)pvVar4 + 0x10);
              iVar5 = strcmp(*(char **)((long)pvVar18 + 0x10),pcVar21);
              if (iVar5 == 0) {
                *(void **)((long)pvVar18 + 8) = pvVar4;
                *(void **)((long)pvVar4 + 8) = pvVar18;
                if (local_60 == (char *)0x0) {
                  local_60 = pcVar21;
                }
                uVar7 = uVar7 + 1;
              }
            }
            lVar17 = lVar17 + 1;
            pvVar18 = pvVar4;
          } while (lVar15 != lVar17);
          if (uVar7 != 0) {
            printf("Warning: Detected %d multi-output gates (for example, \"%s\").\n",(ulong)uVar7,
                   local_60);
          }
        }
        return p;
      }
    } while( true );
  }
LAB_003cbd4b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Amap_Lib_t * Amap_ParseTokens( Vec_Ptr_t * vTokens, int fVerbose )
{
    Amap_Lib_t * p;
    Amap_Gat_t * pGate, * pPrev;
    Amap_Pin_t * pPin;
    char * pToken, * pMoGate = NULL;
    int i, nPins, iPos = 0, Count = 0;
    p = Amap_LibAlloc();
    pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
    do 
    {
        if ( strcmp( pToken, AMAP_STRING_GATE ) )
        {
            Amap_LibFree( p );
            printf( "The first line should begin with %s.\n", AMAP_STRING_GATE );
            return NULL;
        }
        // start gate
        nPins = Amap_ParseCountPins( vTokens, iPos );
        pGate = Amap_ParseGateAlloc( p->pMemGates, nPins );
        memset( pGate, 0, sizeof(Amap_Gat_t) );
        pGate->Id = Vec_PtrSize( p->vGates );
        Vec_PtrPush( p->vGates, pGate );
        pGate->pLib = p;
        pGate->nPins = nPins;
        // read gate
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pName = Amap_ParseStrsav( p->pMemGates, pToken );    
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->dArea = atof( pToken );
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        pGate->pOutName = Amap_ParseStrsav( p->pMemGates, pToken ); 
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
        iPos = Amap_CollectFormulaTokens( vTokens, pToken, iPos );
        pGate->pForm = Amap_ParseStrsav( p->pMemGates, pToken ); 
        // read pins
        Amap_GateForEachPin( pGate, pPin )
        {
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_PIN ) )
            {
                Amap_LibFree( p );
                printf( "Cannot parse gate %s.\n", pGate->pName );
                return NULL;
            }
            // read pin
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->pName = Amap_ParseStrsav( p->pMemGates, pToken );   
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            if ( strcmp( pToken, AMAP_STRING_UNKNOWN ) == 0 )
                pPin->Phase = AMAP_PHASE_UNKNOWN;
            else if ( strcmp( pToken, AMAP_STRING_INV ) == 0 )
                pPin->Phase = AMAP_PHASE_INV;
            else if ( strcmp( pToken, AMAP_STRING_NONINV ) == 0 )
                pPin->Phase = AMAP_PHASE_NONINV;
            else 
            {
                Amap_LibFree( p );
                printf( "Cannot read phase of pin %s of gate %s\n", pPin->pName, pGate->pName );
                return NULL;
            }
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadInput = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dLoadMax = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutRise = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayBlockFall = atof( pToken );
            pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
            pPin->dDelayFanoutFall = atof( pToken );
            if ( pPin->dDelayBlockRise > pPin->dDelayBlockFall )
                pPin->dDelayBlockMax = pPin->dDelayBlockRise;
            else
                pPin->dDelayBlockMax = pPin->dDelayBlockFall;
        }
        // fix the situation when all pins are represented as one
        if ( pGate->nPins == 1 && !strcmp( pGate->Pins->pName, "*" ) )
        {
            pGate = Amap_ParseGateWithSamePins( pGate );
            Vec_PtrPop( p->vGates );
            Vec_PtrPush( p->vGates, pGate );
        }
        pToken = (char *)Vec_PtrEntry(vTokens, iPos++);
//printf( "Finished reading gate %s (%s)\n", pGate->pName, pGate->pOutName );
    }
    while ( strcmp( pToken, ".end" ) );

    // check if there are gates with identical names
    pPrev = NULL;
    Amap_LibForEachGate( p, pGate, i )
    {
        if ( pPrev && !strcmp(pPrev->pName, pGate->pName) )
        {
            pPrev->pTwin = pGate, pGate->pTwin = pPrev;
//            printf( "Warning: Detected multi-output gate \"%s\".\n", pGate->pName );
            if ( pMoGate == NULL )
                pMoGate = pGate->pName;
            Count++;
        }
        pPrev = pGate;
    }
    if ( Count )
        printf( "Warning: Detected %d multi-output gates (for example, \"%s\").\n", Count, pMoGate );
    return p;
}